

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::ValidationState_t::CooperativeMatrixShapesMatch
          (ValidationState_t *this,Instruction *inst,uint32_t result_type_id,uint32_t m2,
          bool is_conversion,bool swap_row_col)

{
  bool bVar1;
  Op OVar2;
  Op OVar3;
  DiagnosticStream *pDVar4;
  DiagnosticStream local_ab8;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_8e0;
  tuple<bool,_bool,_unsigned_int> local_8c8;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_8c0;
  tuple<bool,_bool,_unsigned_int> local_8a8;
  uint local_8a0;
  uint32_t local_89c;
  uint32_t m2_use_id;
  uint32_t m1_use_id;
  DiagnosticStream local_890;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_6b8;
  tuple<bool,_bool,_unsigned_int> local_6a0;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_698;
  tuple<bool,_bool,_unsigned_int> local_680;
  char *local_678;
  DiagnosticStream local_670;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_498;
  tuple<bool,_bool,_unsigned_int> local_480;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_478;
  tuple<bool,_bool,_unsigned_int> local_460;
  DiagnosticStream local_458;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_280;
  tuple<bool,_bool,_unsigned_int> local_268;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_260;
  tuple<bool,_bool,_unsigned_int> local_244;
  uint local_23c;
  uint local_238;
  uint32_t m2_value;
  uint32_t m1_value;
  bool m2_is_const_int32;
  bool m2_is_int32;
  bool m1_is_const_int32;
  bool m1_is_int32;
  uint32_t m2_cols_id;
  uint32_t m2_rows_id;
  uint32_t m2_scope_id;
  uint32_t m1_cols_id;
  uint32_t m1_rows_id;
  uint32_t m1_scope_id;
  Instruction *local_40;
  Instruction *m2_type;
  Instruction *m1_type;
  uint32_t local_28;
  bool swap_row_col_local;
  uint32_t uStack_24;
  bool is_conversion_local;
  uint32_t m2_local;
  uint32_t result_type_id_local;
  Instruction *inst_local;
  ValidationState_t *this_local;
  
  m1_type._6_1_ = swap_row_col;
  m1_type._7_1_ = is_conversion;
  local_28 = m2;
  uStack_24 = result_type_id;
  _m2_local = inst;
  inst_local = (Instruction *)this;
  m2_type = FindDef(this,result_type_id);
  local_40 = FindDef(this,local_28);
  OVar2 = val::Instruction::opcode(m2_type);
  OVar3 = val::Instruction::opcode(local_40);
  if (OVar2 == OVar3) {
    m1_cols_id = val::Instruction::GetOperandAs<unsigned_int>(m2_type,2);
    m2_scope_id = val::Instruction::GetOperandAs<unsigned_int>(m2_type,3);
    m2_rows_id = val::Instruction::GetOperandAs<unsigned_int>(m2_type,4);
    m2_cols_id = val::Instruction::GetOperandAs<unsigned_int>(local_40,2);
    _m2_is_const_int32 = val::Instruction::GetOperandAs<unsigned_int>(local_40,3);
    m1_value = val::Instruction::GetOperandAs<unsigned_int>(local_40,4);
    if ((m1_type._6_1_ & 1) != 0) {
      std::swap<unsigned_int>(&m2_scope_id,&m2_rows_id);
    }
    m2_value._3_1_ = 0;
    m2_value._2_1_ = 0;
    m2_value._1_1_ = 0;
    m2_value._0_1_ = 0;
    local_238 = 0;
    local_23c = 0;
    EvalInt32IfConst(&local_244,this,m1_cols_id);
    std::tie<bool,bool,unsigned_int>
              (&local_260,(bool *)((long)&m2_value + 3),(bool *)((long)&m2_value + 2),&local_238);
    std::tuple<bool&,bool&,unsigned_int&>::operator=
              ((tuple<bool&,bool&,unsigned_int&> *)&local_260,&local_244);
    EvalInt32IfConst(&local_268,this,m2_cols_id);
    std::tie<bool,bool,unsigned_int>
              (&local_280,(bool *)((long)&m2_value + 1),(bool *)&m2_value,&local_23c);
    std::tuple<bool&,bool&,unsigned_int&>::operator=
              ((tuple<bool&,bool&,unsigned_int&> *)&local_280,&local_268);
    if ((((m2_value._2_1_ & 1) == 0) || (((byte)m2_value & 1) == 0)) || (local_238 == local_23c)) {
      EvalInt32IfConst(&local_460,this,m2_scope_id);
      std::tie<bool,bool,unsigned_int>
                (&local_478,(bool *)((long)&m2_value + 3),(bool *)((long)&m2_value + 2),&local_238);
      std::tuple<bool&,bool&,unsigned_int&>::operator=
                ((tuple<bool&,bool&,unsigned_int&> *)&local_478,&local_460);
      EvalInt32IfConst(&local_480,this,_m2_is_const_int32);
      std::tie<bool,bool,unsigned_int>
                (&local_498,(bool *)((long)&m2_value + 1),(bool *)&m2_value,&local_23c);
      std::tuple<bool&,bool&,unsigned_int&>::operator=
                ((tuple<bool&,bool&,unsigned_int&> *)&local_498,&local_480);
      if ((((m2_value._2_1_ & 1) == 0) || (((byte)m2_value & 1) == 0)) || (local_238 == local_23c))
      {
        EvalInt32IfConst(&local_680,this,m2_rows_id);
        std::tie<bool,bool,unsigned_int>
                  (&local_698,(bool *)((long)&m2_value + 3),(bool *)((long)&m2_value + 2),&local_238
                  );
        std::tuple<bool&,bool&,unsigned_int&>::operator=
                  ((tuple<bool&,bool&,unsigned_int&> *)&local_698,&local_680);
        EvalInt32IfConst(&local_6a0,this,m1_value);
        std::tie<bool,bool,unsigned_int>
                  (&local_6b8,(bool *)((long)&m2_value + 1),(bool *)&m2_value,&local_23c);
        std::tuple<bool&,bool&,unsigned_int&>::operator=
                  ((tuple<bool&,bool&,unsigned_int&> *)&local_6b8,&local_6a0);
        if ((((m2_value._2_1_ & 1) == 0) || (((byte)m2_value & 1) == 0)) || (local_238 == local_23c)
           ) {
          OVar2 = val::Instruction::opcode(m2_type);
          if (OVar2 == OpTypeCooperativeMatrixKHR) {
            local_89c = val::Instruction::GetOperandAs<unsigned_int>(m2_type,5);
            local_8a0 = val::Instruction::GetOperandAs<unsigned_int>(local_40,5);
            EvalInt32IfConst(&local_8a8,this,local_89c);
            std::tie<bool,bool,unsigned_int>
                      (&local_8c0,(bool *)((long)&m2_value + 3),(bool *)((long)&m2_value + 2),
                       &local_238);
            std::tuple<bool&,bool&,unsigned_int&>::operator=
                      ((tuple<bool&,bool&,unsigned_int&> *)&local_8c0,&local_8a8);
            EvalInt32IfConst(&local_8c8,this,local_8a0);
            std::tie<bool,bool,unsigned_int>
                      (&local_8e0,(bool *)((long)&m2_value + 1),(bool *)&m2_value,&local_23c);
            std::tuple<bool&,bool&,unsigned_int&>::operator=
                      ((tuple<bool&,bool&,unsigned_int&> *)&local_8e0,&local_8c8);
            if (((((m2_value._2_1_ & 1) != 0) && (((byte)m2_value & 1) != 0)) &&
                (local_238 != local_23c)) &&
               ((((m1_type._7_1_ & 1) == 0 ||
                 (bVar1 = HasCapability(this,CapabilityCooperativeMatrixConversionsNV), !bVar1)) ||
                (local_23c != 2)))) {
              diag(&local_ab8,this,SPV_ERROR_INVALID_DATA,_m2_local);
              pDVar4 = DiagnosticStream::operator<<
                                 (&local_ab8,
                                  (char (*) [51])
                                  "Expected Use of Matrix type and Result Type to be ");
              pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [10])0xf465fd);
              this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
              DiagnosticStream::~DiagnosticStream(&local_ab8);
              return this_local._4_4_;
            }
          }
          this_local._4_4_ = SPV_SUCCESS;
        }
        else {
          diag(&local_890,this,SPV_ERROR_INVALID_DATA,_m2_local);
          pDVar4 = DiagnosticStream::operator<<
                             (&local_890,
                              (char (*) [55])
                              "Expected columns of Matrix type and Result Type to be ");
          _m2_use_id = "identical";
          if ((m1_type._6_1_ & 1) != 0) {
            _m2_use_id = "swapped with rows";
          }
          pDVar4 = DiagnosticStream::operator<<(pDVar4,(char **)&m2_use_id);
          this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
          DiagnosticStream::~DiagnosticStream(&local_890);
        }
      }
      else {
        diag(&local_670,this,SPV_ERROR_INVALID_DATA,_m2_local);
        pDVar4 = DiagnosticStream::operator<<
                           (&local_670,
                            (char (*) [52])"Expected rows of Matrix type and Result Type to be ");
        local_678 = "identical";
        if ((m1_type._6_1_ & 1) != 0) {
          local_678 = "swapped with columns";
        }
        pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_678);
        this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream(&local_670);
      }
    }
    else {
      diag(&local_458,this,SPV_ERROR_INVALID_DATA,_m2_local);
      pDVar4 = DiagnosticStream::operator<<
                         (&local_458,
                          (char (*) [49])"Expected scopes of Matrix and Result Type to be ");
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [10])0xf465fd);
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_458);
    }
  }
  else {
    diag((DiagnosticStream *)&m1_rows_id,this,SPV_ERROR_INVALID_DATA,_m2_local);
    pDVar4 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&m1_rows_id,
                        (char (*) [34])"Expected cooperative matrix types");
    this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&m1_rows_id);
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t ValidationState_t::CooperativeMatrixShapesMatch(
    const Instruction* inst, uint32_t result_type_id, uint32_t m2,
    bool is_conversion, bool swap_row_col) {
  const auto m1_type = FindDef(result_type_id);
  const auto m2_type = FindDef(m2);

  if (m1_type->opcode() != m2_type->opcode()) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected cooperative matrix types";
  }

  uint32_t m1_scope_id = m1_type->GetOperandAs<uint32_t>(2);
  uint32_t m1_rows_id = m1_type->GetOperandAs<uint32_t>(3);
  uint32_t m1_cols_id = m1_type->GetOperandAs<uint32_t>(4);

  uint32_t m2_scope_id = m2_type->GetOperandAs<uint32_t>(2);
  uint32_t m2_rows_id = m2_type->GetOperandAs<uint32_t>(3);
  uint32_t m2_cols_id = m2_type->GetOperandAs<uint32_t>(4);

  if (swap_row_col) {
    std::swap(m1_rows_id, m1_cols_id);
  }

  bool m1_is_int32 = false, m1_is_const_int32 = false, m2_is_int32 = false,
       m2_is_const_int32 = false;
  uint32_t m1_value = 0, m2_value = 0;

  std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
      EvalInt32IfConst(m1_scope_id);
  std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
      EvalInt32IfConst(m2_scope_id);

  if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected scopes of Matrix and Result Type to be "
           << "identical";
  }

  std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
      EvalInt32IfConst(m1_rows_id);
  std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
      EvalInt32IfConst(m2_rows_id);

  if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected rows of Matrix type and Result Type to be "
           << (swap_row_col ? "swapped with columns" : "identical");
  }

  std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
      EvalInt32IfConst(m1_cols_id);
  std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
      EvalInt32IfConst(m2_cols_id);

  if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected columns of Matrix type and Result Type to be "
           << (swap_row_col ? "swapped with rows" : "identical");
  }

  if (m1_type->opcode() == spv::Op::OpTypeCooperativeMatrixKHR) {
    uint32_t m1_use_id = m1_type->GetOperandAs<uint32_t>(5);
    uint32_t m2_use_id = m2_type->GetOperandAs<uint32_t>(5);
    std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
        EvalInt32IfConst(m1_use_id);
    std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
        EvalInt32IfConst(m2_use_id);

    if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value &&
        // CooperativeMatrixConversionsNV allows conversions from Acc->A/B
        !(is_conversion &&
          HasCapability(spv::Capability::CooperativeMatrixConversionsNV) &&
          m2_value ==
              (uint32_t)spv::CooperativeMatrixUse::MatrixAccumulatorKHR)) {
      return diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Use of Matrix type and Result Type to be "
             << "identical";
    }
  }

  return SPV_SUCCESS;
}